

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O0

kiss_fftnd_cfg kiss_fftnd_alloc(int *dims,int ndims,int inverse_fft,void *mem,size_t *lenmem)

{
  size_t __size;
  int *piVar1;
  kiss_fft_cfg pkVar2;
  kiss_fftnd_cfg in_RCX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  size_t len;
  size_t sublen;
  char *ptr;
  size_t memneeded;
  int dimprod;
  int i;
  kiss_fftnd_cfg st;
  long local_58;
  kiss_fft_cpx *local_48;
  int local_38;
  int local_34;
  kiss_fftnd_cfg local_8;
  
  local_8 = (kiss_fftnd_cfg)0x0;
  local_38 = 1;
  for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
    kiss_fft_alloc((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,(size_t *)local_8);
    local_38 = *(int *)(in_RDI + (long)local_34 * 4) * local_38;
  }
  __size = (long)local_38 * 8 + (long)in_ESI * 8 + (long)in_ESI * 4 + 0x20;
  if (in_R8 == (ulong *)0x0) {
    local_8 = (kiss_fftnd_cfg)malloc(__size);
  }
  else {
    if (__size <= *in_R8) {
      local_8 = in_RCX;
    }
    *in_R8 = __size;
  }
  if (local_8 == (kiss_fftnd_cfg)0x0) {
    local_8 = (kiss_fftnd_cfg)0x0;
  }
  else {
    local_8->dimprod = local_38;
    local_8->ndims = in_ESI;
    local_8->states = (kiss_fft_cfg *)(local_8 + 1);
    piVar1 = &local_8[1].dimprod + (long)in_ESI * 2;
    local_8->dims = piVar1;
    local_8->tmpbuf = (kiss_fft_cpx *)(piVar1 + in_ESI);
    local_48 = (kiss_fft_cpx *)(piVar1 + in_ESI) + local_38;
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      local_8->dims[local_34] = *(int *)(in_RDI + (long)local_34 * 4);
      kiss_fft_alloc((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,(size_t *)local_8);
      pkVar2 = kiss_fft_alloc((int)((ulong)in_RCX >> 0x20),(int)in_RCX,in_R8,(size_t *)local_8);
      local_8->states[local_34] = pkVar2;
      local_48 = (kiss_fft_cpx *)((long)&local_48->r + local_58);
    }
    if ((long)local_48 - (long)local_8 != (long)(int)__size) {
      fprintf(_stderr,
              "################################################################################\nInternal error! Memory allocation miscalculation\n################################################################################\n"
             );
    }
  }
  return local_8;
}

Assistant:

kiss_fftnd_cfg kiss_fftnd_alloc(const int *dims,int ndims,int inverse_fft,void*mem,size_t*lenmem)
{
    kiss_fftnd_cfg st = NULL;
    int i;
    int dimprod=1;
    size_t memneeded = sizeof(struct kiss_fftnd_state);
    char * ptr;

    for (i=0;i<ndims;++i) {
        size_t sublen=0;
        kiss_fft_alloc (dims[i], inverse_fft, NULL, &sublen);
        memneeded += sublen;   /* st->states[i] */
        dimprod *= dims[i];
    }
    memneeded += sizeof(int) * ndims;/*  st->dims */
    memneeded += sizeof(void*) * ndims;/* st->states  */
    memneeded += sizeof(kiss_fft_cpx) * dimprod; /* st->tmpbuf */

    if (lenmem == NULL) {/* allocate for the caller*/
        st = (kiss_fftnd_cfg) malloc (memneeded);
    } else { /* initialize supplied buffer if big enough */
        if (*lenmem >= memneeded)
            st = (kiss_fftnd_cfg) mem;
        *lenmem = memneeded; /*tell caller how big struct is (or would be) */
    }
    if (!st)
        return NULL; /*malloc failed or buffer too small */

    st->dimprod = dimprod;
    st->ndims = ndims;
    ptr=(char*)(st+1);

    st->states = (kiss_fft_cfg *)ptr;
    ptr += sizeof(void*) * ndims;

    st->dims = (int*)ptr;
    ptr += sizeof(int) * ndims;

    st->tmpbuf = (kiss_fft_cpx*)ptr;
    ptr += sizeof(kiss_fft_cpx) * dimprod;

    for (i=0;i<ndims;++i) {
        size_t len;
        st->dims[i] = dims[i];
        kiss_fft_alloc (st->dims[i], inverse_fft, NULL, &len);
        st->states[i] = kiss_fft_alloc (st->dims[i], inverse_fft, ptr,&len);
        ptr += len;
    }
    /*
Hi there!

If you're looking at this particular code, it probably means you've got a brain-dead bounds checker 
that thinks the above code overwrites the end of the array.

It doesn't.

-- Mark 

P.S.
The below code might give you some warm fuzzies and help convince you.
       */
    if ( ptr - (char*)st != (int)memneeded ) {
        fprintf(stderr,
                "################################################################################\n"
                "Internal error! Memory allocation miscalculation\n"
                "################################################################################\n"
               );
    }
    return st;
}